

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void sep_downsample(j_compress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_index,
                   JSAMPIMAGE output_buf,JDIMENSION out_row_group_index)

{
  jpeg_downsampler *pjVar1;
  long lVar2;
  
  if (0 < cinfo->num_components) {
    pjVar1 = cinfo->downsample;
    lVar2 = 0;
    do {
      (*(&pjVar1[1].start_pass)[lVar2])(cinfo);
      lVar2 = lVar2 + 1;
    } while (lVar2 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
sep_downsample(j_compress_ptr cinfo, JSAMPIMAGE input_buf,
               JDIMENSION in_row_index, JSAMPIMAGE output_buf,
               JDIMENSION out_row_group_index)
{
  my_downsample_ptr downsample = (my_downsample_ptr)cinfo->downsample;
  int ci;
  jpeg_component_info *compptr;
  JSAMPARRAY in_ptr, out_ptr;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    in_ptr = input_buf[ci] + in_row_index;
    out_ptr = output_buf[ci] + (out_row_group_index * compptr->v_samp_factor);
    (*downsample->methods[ci]) (cinfo, compptr, in_ptr, out_ptr);
  }
}